

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statement.cpp
# Opt level: O2

void cs::foreach_helper<std::__cxx11::list<cs_impl::any,std::allocator<cs_impl::any>>,cs_impl::any>
               (context_t *context,string *iterator,var *obj,
               deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *body)

{
  element_type *peVar1;
  _Elt_pointer ppsVar2;
  _List_node_base *p_Var3;
  _Elt_pointer ppsVar4;
  _Elt_pointer ppsVar5;
  scope_guard scope;
  scope_guard local_b0;
  _Map_pointer local_a8;
  _List_node_base *local_a0;
  string *local_98;
  
  local_98 = iterator;
  p_Var3 = (_List_node_base *)
           cs_impl::any::const_val<std::__cxx11::list<cs_impl::any,std::allocator<cs_impl::any>>>
                     (obj);
  if ((((_List_base<cs_impl::any,_std::allocator<cs_impl::any>_> *)&p_Var3->_M_next)->_M_impl).
      _M_node.super__List_node_base._M_next != p_Var3) {
    peVar1 = (((context->super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
             instance).super___shared_ptr<cs::instance_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if (peVar1->break_block == true) {
      peVar1->break_block = false;
    }
    if (peVar1->continue_block == true) {
      peVar1->continue_block = false;
    }
    scope_guard::scope_guard(&local_b0,context);
    p_Var3 = (_List_node_base *)
             cs_impl::any::const_val<std::__cxx11::list<cs_impl::any,std::allocator<cs_impl::any>>>
                       (obj);
    local_a0 = p_Var3;
    while (p_Var3 = (((_List_base<cs_impl::any,_std::allocator<cs_impl::any>_> *)&p_Var3->_M_next)->
                    _M_impl)._M_node.super__List_node_base._M_next, p_Var3 != local_a0) {
      process_context::poll_event((process_context *)current_process);
      domain_manager::add_var_no_return<std::__cxx11::string_const&>
                (&(((((context->super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>).
                     _M_ptr)->instance).
                    super___shared_ptr<cs::instance_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                  super_runtime_type).storage,local_98,(var *)(p_Var3 + 1));
      ppsVar4 = (body->
                super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>).
                _M_impl.super__Deque_impl_data._M_start._M_cur;
      ppsVar5 = (body->
                super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>).
                _M_impl.super__Deque_impl_data._M_start._M_last;
      local_a8 = (body->
                 super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>).
                 _M_impl.super__Deque_impl_data._M_start._M_node;
      ppsVar2 = (body->
                super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>).
                _M_impl.super__Deque_impl_data._M_finish._M_cur;
      while (ppsVar4 != ppsVar2) {
        statement_base::run(*ppsVar4);
        peVar1 = (((context->super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>).
                  _M_ptr)->instance).
                 super___shared_ptr<cs::instance_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        if (peVar1->return_fcall != false) goto LAB_00160cd3;
        if (peVar1->break_block == true) {
          peVar1->break_block = false;
          goto LAB_00160cd3;
        }
        if (peVar1->continue_block != false) {
          peVar1->continue_block = false;
          break;
        }
        ppsVar4 = ppsVar4 + 1;
        if (ppsVar4 == ppsVar5) {
          ppsVar4 = local_a8[1];
          local_a8 = local_a8 + 1;
          ppsVar5 = ppsVar4 + 0x40;
        }
      }
      scope_guard::clear(&local_b0);
    }
LAB_00160cd3:
    scope_guard::~scope_guard(&local_b0);
  }
  return;
}

Assistant:

void foreach_helper(const context_t &context, const string &iterator, const var &obj,
	                    std::deque<statement_base *> &body)
	{
		if (obj.const_val<T>().empty())
			return;
		if (context->instance->break_block)
			context->instance->break_block = false;
		if (context->instance->continue_block)
			context->instance->continue_block = false;
		scope_guard scope(context);
		for (const X &it: obj.const_val<T>()) {
			current_process->poll_event();
			context->instance->storage.add_var_no_return(iterator, it);
			for (auto &ptr: body) {
				try {
					ptr->run();
				}
				catch (const cs::exception &e) {
					throw e;
				}
				catch (const std::exception &e) {
					throw exception(ptr->get_line_num(), ptr->get_file_path(), ptr->get_raw_code(), e.what());
				}
				if (context->instance->return_fcall) {
					return;
				}
				if (context->instance->break_block) {
					context->instance->break_block = false;
					return;
				}
				if (context->instance->continue_block) {
					context->instance->continue_block = false;
					break;
				}
			}
			scope.clear();
		}
	}